

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_constructCopy(ktxTexture2 *This,ktxTexture2 *orig)

{
  ktx_bool_t kVar1;
  void *pvVar2;
  ktxHashList orig_00;
  void *in_RSI;
  void *in_RDI;
  ktx_size_t privateSize;
  ktx_error_code_e result;
  ktx_uint8_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ktx_error_code_e local_4;
  
  memcpy(in_RDI,in_RSI,0xa8);
  *(undefined8 *)((long)in_RDI + 0x18) = 0;
  *(undefined8 *)((long)in_RDI + 0xa0) = 0;
  *(undefined8 *)((long)in_RDI + 0x80) = 0;
  *(undefined8 *)((long)in_RDI + 0x60) = 0;
  *(undefined8 *)((long)in_RDI + 0x50) = 0;
  *(undefined8 *)((long)in_RDI + 0x70) = 0;
  pvVar2 = malloc(0xa8);
  *(void **)((long)in_RDI + 0x18) = pvVar2;
  if (*(long *)((long)in_RDI + 0x18) == 0) {
    return KTX_OUT_OF_MEMORY;
  }
  if ((*(long *)((long)in_RSI + 0x70) == 0) &&
     (kVar1 = ktxTexture_isActiveStream
                        ((ktxTexture *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                        ), kVar1)) {
    ktxTexture2_LoadImageData
              ((ktxTexture2 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,0x462b72);
  }
  memcpy(*(void **)((long)in_RDI + 0x18),*(void **)((long)in_RSI + 0x18),0xa8);
  orig_00 = (ktxHashList)((ulong)(*(int *)((long)in_RSI + 0x34) - 1) * 0x18 + 0x38);
  pvVar2 = malloc((size_t)orig_00);
  *(void **)((long)in_RDI + 0xa0) = pvVar2;
  if (*(long *)((long)in_RDI + 0xa0) != 0) {
    memcpy(*(void **)((long)in_RDI + 0xa0),*(void **)((long)in_RSI + 0xa0),(size_t)orig_00);
    if (*(long *)(*(long *)((long)in_RSI + 0xa0) + 0x10) != 0) {
      pvVar2 = malloc(*(size_t *)(*(long *)((long)in_RSI + 0xa0) + 0x10));
      **(undefined8 **)((long)in_RDI + 0xa0) = pvVar2;
      if (**(long **)((long)in_RDI + 0xa0) == 0) goto LAB_00462dda;
      memcpy((void *)**(undefined8 **)((long)in_RDI + 0xa0),
             (void *)**(undefined8 **)((long)in_RSI + 0xa0),
             *(size_t *)(*(long *)((long)in_RSI + 0xa0) + 0x10));
    }
    pvVar2 = malloc((ulong)**(uint **)((long)in_RSI + 0x80));
    *(void **)((long)in_RDI + 0x80) = pvVar2;
    if (*(long *)((long)in_RDI + 0x80) != 0) {
      memcpy(*(void **)((long)in_RDI + 0x80),*(void **)((long)in_RSI + 0x80),
             (ulong)**(uint **)((long)in_RSI + 0x80));
      if (*(long *)((long)in_RSI + 0x50) == 0) {
        if (*(long *)((long)in_RSI + 0x60) != 0) {
          pvVar2 = malloc((ulong)*(uint *)((long)in_RSI + 0x58));
          *(void **)((long)in_RDI + 0x60) = pvVar2;
          if (*(long *)((long)in_RDI + 0x60) == 0) goto LAB_00462dda;
          memcpy(*(void **)((long)in_RDI + 0x60),*(void **)((long)in_RSI + 0x60),
                 (ulong)*(uint *)((long)in_RSI + 0x58));
        }
      }
      else {
        ktxHashList_ConstructCopy
                  ((ktxHashList *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   orig_00);
      }
      pvVar2 = malloc(*(size_t *)((long)in_RDI + 0x68));
      *(void **)((long)in_RDI + 0x70) = pvVar2;
      if (*(long *)((long)in_RDI + 0x70) != 0) {
        memcpy(*(void **)((long)in_RDI + 0x70),*(void **)((long)in_RSI + 0x70),
               *(size_t *)((long)in_RSI + 0x68));
        return KTX_SUCCESS;
      }
    }
  }
LAB_00462dda:
  local_4 = KTX_OUT_OF_MEMORY;
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    free(*(void **)((long)in_RDI + 0x18));
  }
  if (*(long *)((long)in_RDI + 0xa0) != 0) {
    if (**(long **)((long)in_RDI + 0xa0) != 0) {
      free((void *)**(undefined8 **)((long)in_RDI + 0xa0));
    }
    free(*(void **)((long)in_RDI + 0xa0));
  }
  if (*(long *)((long)in_RDI + 0x80) != 0) {
    free(*(void **)((long)in_RDI + 0x80));
  }
  if (*(long *)((long)in_RDI + 0x50) != 0) {
    ktxHashList_Destruct((ktxHashList *)privateSize);
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_constructCopy(ktxTexture2* This, ktxTexture2* orig)
{
    KTX_error_code result;

    memcpy(This, orig, sizeof(ktxTexture2));
    // Zero all the pointers to make error handling easier
    This->_protected = NULL;
    This->_private = NULL;
    This->pDfd = NULL;
    This->kvData = NULL;
    This->kvDataHead = NULL;
    This->pData = NULL;

    This->_protected =
                    (ktxTexture_protected*)malloc(sizeof(ktxTexture_protected));
    if (!This->_protected)
        return KTX_OUT_OF_MEMORY;
    // Must come before memcpy of _protected so as to close an active stream.
    if (!orig->pData && ktxTexture_isActiveStream((ktxTexture*)orig))
        ktxTexture2_LoadImageData(orig, NULL, 0);
    memcpy(This->_protected, orig->_protected, sizeof(ktxTexture_protected));

    ktx_size_t privateSize = sizeof(ktxTexture2_private)
                           + sizeof(ktxLevelIndexEntry) * (orig->numLevels - 1);
    This->_private = (ktxTexture2_private*)malloc(privateSize);
    if (This->_private == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    memcpy(This->_private, orig->_private, privateSize);
    if (orig->_private->_sgdByteLength > 0) {
        This->_private->_supercompressionGlobalData
                        = (ktx_uint8_t*)malloc(orig->_private->_sgdByteLength);
        if (!This->_private->_supercompressionGlobalData) {
            result = KTX_OUT_OF_MEMORY;
            goto cleanup;
        }
        memcpy(This->_private->_supercompressionGlobalData,
               orig->_private->_supercompressionGlobalData,
               orig->_private->_sgdByteLength);
    }

    This->pDfd = (ktx_uint32_t*)malloc(*orig->pDfd);
    if (!This->pDfd) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    memcpy(This->pDfd, orig->pDfd, *orig->pDfd);

    if (orig->kvDataHead) {
        ktxHashList_ConstructCopy(&This->kvDataHead, orig->kvDataHead);
    } else if (orig->kvData) {
        This->kvData = (ktx_uint8_t*)malloc(orig->kvDataLen);
        if (!This->kvData) {
            result = KTX_OUT_OF_MEMORY;
            goto cleanup;
        }
        memcpy(This->kvData, orig->kvData, orig->kvDataLen);
    }

    // Can't share the image data as the data pointer is exposed in the
    // ktxTexture2 structure. Changing it to a ref-counted pointer would
    // break code. Maybe that's okay as we're still pre-release. But,
    // since this constructor will be mostly be used when transcoding
    // supercompressed images, it is probably not too big a deal to make
    // a copy of the data.
    This->pData = (ktx_uint8_t*)malloc(This->dataSize);
    if (This->pData == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    memcpy(This->pData, orig->pData, orig->dataSize);
    return KTX_SUCCESS;

cleanup:
    if (This->_protected) free(This->_protected);
    if (This->_private) {
        if (This->_private->_supercompressionGlobalData)
            free(This->_private->_supercompressionGlobalData);
        free(This->_private);
    }
    if (This->pDfd) free (This->pDfd);
    if (This->kvDataHead) ktxHashList_Destruct(&This->kvDataHead);

    return result;
}